

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_fstat(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  __uid_t _Var2;
  int extraout_EAX_02;
  uv_loop_t *puVar3;
  int **ppiVar4;
  undefined8 uVar5;
  uv_loop_t *puVar6;
  void *pvVar7;
  char *pcVar8;
  int **ppiVar9;
  int **ppiVar10;
  undefined8 *puVar11;
  uv_loop_t *puVar12;
  char *pcVar13;
  undefined8 *puVar14;
  char *pcVar15;
  int **unaff_R14;
  int **ppiVar16;
  int **ppiVar17;
  int **ppiVar18;
  uv_buf_t uVar19;
  stat t;
  uv_fs_t req;
  undefined1 auStack_f50 [88];
  long lStack_ef8;
  long lStack_ef0;
  code *pcStack_d98;
  code *pcStack_d90;
  undefined8 uStack_d88;
  char acStack_d78 [88];
  char *pcStack_d20;
  uv_loop_t *puStack_bc0;
  int **ppiStack_bb8;
  code *pcStack_bb0;
  code *pcStack_ba8;
  uv_loop_t *puStack_ba0;
  code *pcStack_b98;
  int *apiStack_b90 [11];
  uv_loop_t *puStack_b38;
  int **ppiStack_9d8;
  int **ppiStack_9d0;
  undefined8 uStack_9c8;
  int *apiStack_9b8 [11];
  int **ppiStack_960;
  undefined8 *puStack_800;
  int **ppiStack_7f8;
  code *pcStack_7f0;
  code *pcStack_7e8;
  undefined1 auStack_7d8 [88];
  long lStack_780;
  uint uStack_760;
  code *pcStack_620;
  undefined8 uStack_618;
  int *apiStack_610 [11];
  char *pcStack_5b8;
  char *pcStack_458;
  int **ppiStack_450;
  int *apiStack_438 [11];
  char *pcStack_3e0;
  char *pcStack_280;
  int **ppiStack_278;
  code *pcStack_270;
  undefined8 local_268;
  stat64 local_258;
  int *local_1c8 [11];
  char *local_170;
  int **local_168;
  undefined1 local_158 [328];
  
  pcVar8 = "test_file";
  pcStack_270 = (code *)0x154892;
  unlink("test_file");
  pcStack_270 = (code *)0x154897;
  loop = (uv_loop_t *)uv_default_loop();
  puVar3 = (uv_loop_t *)0x0;
  pcStack_270 = (code *)0x1548be;
  iVar1 = uv_fs_open(0,local_1c8,"test_file",0x42,0x180,0);
  pcVar13 = local_170;
  if (iVar1 < 0) {
    pcStack_270 = (code *)0x154c23;
    run_test_fs_fstat_cold_1();
LAB_00154c23:
    pcStack_270 = (code *)0x154c28;
    run_test_fs_fstat_cold_2();
LAB_00154c28:
    pcStack_270 = (code *)0x154c2d;
    run_test_fs_fstat_cold_3();
LAB_00154c2d:
    pcStack_270 = (code *)0x154c32;
    run_test_fs_fstat_cold_4();
LAB_00154c32:
    pcStack_270 = (code *)0x154c37;
    run_test_fs_fstat_cold_5();
LAB_00154c37:
    pcStack_270 = (code *)0x154c3c;
    run_test_fs_fstat_cold_6();
LAB_00154c3c:
    pcStack_270 = (code *)0x154c41;
    run_test_fs_fstat_cold_7();
LAB_00154c41:
    pcStack_270 = (code *)0x154c46;
    run_test_fs_fstat_cold_8();
LAB_00154c46:
    pcStack_270 = (code *)0x154c4b;
    run_test_fs_fstat_cold_9();
LAB_00154c4b:
    pcStack_270 = (code *)0x154c50;
    run_test_fs_fstat_cold_10();
LAB_00154c50:
    pcStack_270 = (code *)0x154c55;
    run_test_fs_fstat_cold_11();
LAB_00154c55:
    pcStack_270 = (code *)0x154c5a;
    run_test_fs_fstat_cold_12();
LAB_00154c5a:
    pcStack_270 = (code *)0x154c5f;
    run_test_fs_fstat_cold_13();
LAB_00154c5f:
    pcStack_270 = (code *)0x154c64;
    run_test_fs_fstat_cold_14();
LAB_00154c64:
    pcStack_270 = (code *)0x154c69;
    run_test_fs_fstat_cold_15();
LAB_00154c69:
    pcStack_270 = (code *)0x154c6e;
    run_test_fs_fstat_cold_16();
LAB_00154c6e:
    pcStack_270 = (code *)0x154c73;
    run_test_fs_fstat_cold_17();
LAB_00154c73:
    pcStack_270 = (code *)0x154c78;
    run_test_fs_fstat_cold_18();
LAB_00154c78:
    pcStack_270 = (code *)0x154c7d;
    run_test_fs_fstat_cold_19();
LAB_00154c7d:
    pcStack_270 = (code *)0x154c82;
    run_test_fs_fstat_cold_20();
LAB_00154c82:
    pcStack_270 = (code *)0x154c87;
    run_test_fs_fstat_cold_21();
LAB_00154c87:
    pcStack_270 = (code *)0x154c8c;
    run_test_fs_fstat_cold_22();
LAB_00154c8c:
    pcStack_270 = (code *)0x154c91;
    run_test_fs_fstat_cold_23();
LAB_00154c91:
    pcStack_270 = (code *)0x154c96;
    run_test_fs_fstat_cold_24();
LAB_00154c96:
    pcStack_270 = (code *)0x154c9b;
    run_test_fs_fstat_cold_25();
LAB_00154c9b:
    pcStack_270 = (code *)0x154ca0;
    run_test_fs_fstat_cold_26();
LAB_00154ca0:
    pcStack_270 = (code *)0x154ca5;
    run_test_fs_fstat_cold_27();
LAB_00154ca5:
    pcStack_270 = (code *)0x154caa;
    run_test_fs_fstat_cold_28();
LAB_00154caa:
    pcStack_270 = (code *)0x154caf;
    run_test_fs_fstat_cold_29();
LAB_00154caf:
    pcStack_270 = (code *)0x154cb4;
    run_test_fs_fstat_cold_30();
LAB_00154cb4:
    pcStack_270 = (code *)0x154cb9;
    run_test_fs_fstat_cold_31();
LAB_00154cb9:
    pcStack_270 = (code *)0x154cbe;
    run_test_fs_fstat_cold_32();
LAB_00154cbe:
    pcStack_270 = (code *)0x154cc3;
    run_test_fs_fstat_cold_33();
LAB_00154cc3:
    pcStack_270 = (code *)0x154cc8;
    run_test_fs_fstat_cold_34();
LAB_00154cc8:
    pcStack_270 = (code *)0x154ccd;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar8 = local_170;
    if ((long)local_170 < 0) goto LAB_00154c23;
    pcStack_270 = (code *)0x1548e4;
    uv_fs_req_cleanup(local_1c8);
    puVar3 = (uv_loop_t *)((ulong)pcVar13 & 0xffffffff);
    pcStack_270 = (code *)0x1548f0;
    iVar1 = fstat64((int)pcVar13,&local_258);
    pcVar8 = pcVar13;
    if (iVar1 != 0) goto LAB_00154c28;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x15490b;
    iVar1 = uv_fs_fstat(0,local_1c8,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154c2d;
    if (local_170 != (char *)0x0) goto LAB_00154c32;
    if ((local_168[0x12] != (int *)0x0) && (local_168[0x12] != (int *)local_258.st_ctim.tv_sec))
    goto LAB_00154c37;
    if ((local_168[0x13] != (int *)0x0) && (local_168[0x13] != (int *)local_258.st_ctim.tv_nsec))
    goto LAB_00154c3c;
    pcStack_270 = (code *)0x15496c;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_268 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x1549a7;
    iVar1 = uv_fs_write(0,local_1c8,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0xd) goto LAB_00154c41;
    if (local_170 != (char *)0xd) goto LAB_00154c46;
    unaff_R14 = local_1c8;
    pcStack_270 = (code *)0x1549cf;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_270 = (code *)0x1549e6;
    memset(local_158,0xaa,0xa0);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x1549f4;
    iVar1 = uv_fs_fstat(0,unaff_R14,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154c4b;
    if (local_170 != (char *)0x0) goto LAB_00154c50;
    unaff_R14 = local_168;
    if (local_168[7] != (int *)0xd) goto LAB_00154c55;
    puVar3 = (uv_loop_t *)((ulong)pcVar13 & 0xffffffff);
    pcStack_270 = (code *)0x154a2a;
    iVar1 = fstat64((int)pcVar13,&local_258);
    if (iVar1 != 0) goto LAB_00154c5a;
    if (*local_168 != (int *)local_258.st_dev) goto LAB_00154c5f;
    if (local_168[1] != (int *)(ulong)local_258.st_mode) goto LAB_00154c64;
    if (local_168[2] != (int *)local_258.st_nlink) goto LAB_00154c69;
    if (local_168[3] != (int *)(ulong)local_258.st_uid) goto LAB_00154c6e;
    if (local_168[4] != (int *)(ulong)local_258.st_gid) goto LAB_00154c73;
    if (local_168[5] != (int *)local_258.st_rdev) goto LAB_00154c78;
    if (local_168[6] != (int *)local_258.st_ino) goto LAB_00154c7d;
    if (local_168[7] != (int *)local_258.st_size) goto LAB_00154c82;
    if (local_168[8] != (int *)local_258.st_blksize) goto LAB_00154c87;
    if (local_168[9] != (int *)local_258.st_blocks) goto LAB_00154c8c;
    if (local_168[0xc] != (int *)local_258.st_atim.tv_sec) goto LAB_00154c91;
    if (local_168[0xd] != (int *)local_258.st_atim.tv_nsec) goto LAB_00154c96;
    if (local_168[0xe] != (int *)local_258.st_mtim.tv_sec) goto LAB_00154c9b;
    if (local_168[0xf] != (int *)local_258.st_mtim.tv_nsec) goto LAB_00154ca0;
    if (local_168[0x10] != (int *)local_258.st_ctim.tv_sec) goto LAB_00154ca5;
    if (local_168[0x11] != (int *)local_258.st_ctim.tv_nsec) goto LAB_00154caa;
    if (local_168[10] != (int *)0x0) goto LAB_00154caf;
    if (local_168[0xb] != (int *)0x0) goto LAB_00154cb4;
    unaff_R14 = local_1c8;
    pcStack_270 = (code *)0x154b4d;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_270 = (code *)0x154b65;
    puVar3 = loop;
    iVar1 = uv_fs_fstat(loop,unaff_R14,(ulong)pcVar13 & 0xffffffff,fstat_cb);
    if (iVar1 != 0) goto LAB_00154cb9;
    pcStack_270 = (code *)0x154b7b;
    puVar3 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154cbe;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x154b9b;
    iVar1 = uv_fs_close(0,local_1c8,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154cc3;
    if (local_170 != (char *)0x0) goto LAB_00154cc8;
    pcStack_270 = (code *)0x154bbf;
    uv_fs_req_cleanup(local_1c8);
    pcStack_270 = (code *)0x154bcd;
    uv_run(loop,0);
    pcStack_270 = (code *)0x154bd9;
    unlink("test_file");
    pcStack_270 = (code *)0x154bde;
    pcVar8 = (char *)uv_default_loop();
    pcStack_270 = (code *)0x154bf2;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_270 = (code *)0x154bfc;
    uv_run(pcVar8,0);
    pcStack_270 = (code *)0x154c01;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_270 = (code *)0x154c09;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_270 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar3->backend_fd == 8) {
    if (puVar3->watcher_queue[0] != (void *)0x0) goto LAB_00154cfd;
    if (*(long *)((long)puVar3->watcher_queue[1] + 0x38) == 0xd) {
      ppiStack_278 = (int **)0x154cf0;
      pcStack_270._0_4_ = extraout_EAX;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return (int)pcStack_270;
    }
  }
  else {
    ppiStack_278 = (int **)0x154cfd;
    fstat_cb_cold_1();
LAB_00154cfd:
    ppiStack_278 = (int **)0x154d02;
    fstat_cb_cold_2();
  }
  ppiStack_278 = (int **)run_test_fs_access;
  fstat_cb_cold_3();
  ppiVar16 = apiStack_438;
  ppiVar4 = apiStack_438;
  ppiVar9 = (int **)0x184385;
  pcStack_280 = pcVar8;
  ppiStack_278 = unaff_R14;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar3 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_access(0,apiStack_438,"test_file",0,0);
  if (iVar1 < 0) {
    if (-1 < (long)pcStack_3e0) goto LAB_00154f70;
    uv_fs_req_cleanup(apiStack_438);
    puVar3 = loop;
    iVar1 = uv_fs_access(loop,apiStack_438,"test_file",0,access_cb);
    ppiVar9 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154f75;
    puVar3 = loop;
    uv_run(loop,0);
    ppiVar9 = apiStack_438;
    if (access_cb_count != 1) goto LAB_00154f7a;
    access_cb_count = 0;
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,apiStack_438,"test_file",0x42,0x180,0);
    ppiVar10 = (int **)pcStack_3e0;
    ppiVar9 = apiStack_438;
    if (iVar1 < 0) goto LAB_00154f7f;
    if ((long)pcStack_3e0 < 0) goto LAB_00154f84;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_438,"test_file",0,0);
    unaff_R14 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154f89;
    unaff_R14 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154f8e;
    uv_fs_req_cleanup(apiStack_438);
    puVar3 = loop;
    iVar1 = uv_fs_access(loop,apiStack_438,"test_file",0,access_cb);
    if (iVar1 != 0) goto LAB_00154f93;
    puVar3 = loop;
    uv_run(loop,0);
    ppiVar16 = apiStack_438;
    if (access_cb_count != 1) goto LAB_00154f98;
    access_cb_count = 0;
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_close(0,apiStack_438,(ulong)ppiVar10 & 0xffffffff,0);
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154f9d;
    ppiVar16 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154fa2;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_mkdir(0,apiStack_438,"test_dir",0x1ff,0);
    ppiVar10 = apiStack_438;
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154fa7;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_438,"test_dir",2,0);
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154fac;
    ppiVar4 = apiStack_438;
    ppiVar16 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154fb1;
    uv_fs_req_cleanup(apiStack_438);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    ppiVar4 = (int **)uv_default_loop();
    uv_walk(ppiVar4,close_walk_cb,0);
    uv_run(ppiVar4,0);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    ppiVar16 = apiStack_438;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154f70:
    run_test_fs_access_cold_2();
LAB_00154f75:
    run_test_fs_access_cold_3();
LAB_00154f7a:
    run_test_fs_access_cold_4();
LAB_00154f7f:
    ppiVar10 = ppiVar9;
    run_test_fs_access_cold_5();
LAB_00154f84:
    run_test_fs_access_cold_6();
LAB_00154f89:
    run_test_fs_access_cold_7();
LAB_00154f8e:
    ppiVar16 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00154f93:
    run_test_fs_access_cold_9();
LAB_00154f98:
    run_test_fs_access_cold_10();
LAB_00154f9d:
    run_test_fs_access_cold_11();
LAB_00154fa2:
    run_test_fs_access_cold_12();
LAB_00154fa7:
    ppiVar4 = ppiVar10;
    run_test_fs_access_cold_13();
LAB_00154fac:
    run_test_fs_access_cold_14();
LAB_00154fb1:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar3->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    iVar1 = uv_fs_req_cleanup();
    return iVar1;
  }
  access_cb_cold_1();
  pcVar8 = "test_file";
  pcStack_620 = (code *)0x154fed;
  pcStack_458 = (char *)ppiVar4;
  ppiStack_450 = ppiVar16;
  unlink("test_file");
  pcStack_620 = (code *)0x154ff2;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar4 = apiStack_610;
  puVar3 = (uv_loop_t *)0x0;
  pcStack_620 = (code *)0x155016;
  iVar1 = uv_fs_open(0,ppiVar4,"test_file",0x42,0x180,0);
  pcVar13 = pcStack_5b8;
  if (iVar1 < 0) {
    pcStack_620 = (code *)0x1552e9;
    run_test_fs_chmod_cold_1();
LAB_001552e9:
    pcStack_620 = (code *)0x1552ee;
    run_test_fs_chmod_cold_2();
LAB_001552ee:
    pcStack_620 = (code *)0x1552f3;
    run_test_fs_chmod_cold_3();
LAB_001552f3:
    pcStack_620 = (code *)0x1552f8;
    run_test_fs_chmod_cold_4();
LAB_001552f8:
    pcStack_620 = (code *)0x1552fd;
    run_test_fs_chmod_cold_5();
LAB_001552fd:
    pcStack_620 = (code *)0x155302;
    run_test_fs_chmod_cold_6();
LAB_00155302:
    pcStack_620 = (code *)0x155307;
    run_test_fs_chmod_cold_7();
LAB_00155307:
    pcStack_620 = (code *)0x15530c;
    run_test_fs_chmod_cold_8();
LAB_0015530c:
    pcStack_620 = (code *)0x155311;
    run_test_fs_chmod_cold_9();
LAB_00155311:
    pcStack_620 = (code *)0x155316;
    run_test_fs_chmod_cold_10();
LAB_00155316:
    pcStack_620 = (code *)0x15531b;
    run_test_fs_chmod_cold_11();
LAB_0015531b:
    pcStack_620 = (code *)0x155320;
    run_test_fs_chmod_cold_12();
LAB_00155320:
    pcStack_620 = (code *)0x155325;
    run_test_fs_chmod_cold_13();
LAB_00155325:
    pcStack_620 = (code *)0x15532a;
    run_test_fs_chmod_cold_14();
LAB_0015532a:
    pcStack_620 = (code *)0x15532f;
    run_test_fs_chmod_cold_15();
LAB_0015532f:
    pcStack_620 = (code *)0x155334;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar8 = pcStack_5b8;
    if ((long)pcStack_5b8 < 0) goto LAB_001552e9;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x155039;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x15504a;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_618 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x155080;
    ppiVar4 = ppiVar16;
    iov = uVar19;
    iVar1 = uv_fs_write(0,ppiVar16,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = pcVar13;
    if (iVar1 != 0xd) goto LAB_001552ee;
    if (pcStack_5b8 != (char *)0xd) goto LAB_001552f3;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x1550a2;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x1550bb;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001552f8;
    if (pcStack_5b8 != (char *)0x0) goto LAB_001552fd;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x1550dc;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x1550f0;
    check_permission("test_file",0x80);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x155105;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_00155302;
    if (pcStack_5b8 != (char *)0x0) goto LAB_00155307;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x155126;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x155137;
    check_permission("test_file",0x100);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x15514b;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_fchmod(0,ppiVar16,(ulong)pcVar13 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_0015530c;
    if (pcStack_5b8 != (char *)0x0) goto LAB_00155311;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x15516c;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x155180;
    check_permission("test_file",0x180);
    apiStack_610[0] = &run_test_fs_chmod::mode;
    pcStack_620 = (code *)0x1551a8;
    ppiVar4 = ppiVar16;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar16,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_00155316;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x1551be;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015531b;
    chmod_cb_count = 0;
    ppiVar4 = apiStack_610;
    apiStack_610[0] = &run_test_fs_chmod::mode_1;
    pcStack_620 = (code *)0x155203;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar4,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155320;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x155219;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155325;
    ppiVar4 = apiStack_610;
    apiStack_610[0] = &run_test_fs_chmod::mode_2;
    pcStack_620 = (code *)0x15524f;
    puVar3 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar4,(ulong)pcVar13 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015532a;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x155265;
    puVar3 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_0015532f;
    pcStack_620 = (code *)0x155287;
    uv_fs_close(loop,apiStack_610,(ulong)pcVar13 & 0xffffffff,0);
    pcStack_620 = (code *)0x155295;
    uv_run(loop,0);
    pcStack_620 = (code *)0x1552a1;
    unlink("test_file");
    pcStack_620 = (code *)0x1552a6;
    pcVar8 = (char *)uv_default_loop();
    pcStack_620 = (code *)0x1552ba;
    uv_walk(pcVar8,close_walk_cb,0);
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x1552c4;
    uv_run(pcVar8);
    pcStack_620 = (code *)0x1552c9;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_620 = (code *)0x1552d1;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_620 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar11 = (undefined8 *)((ulong)ppiVar4 & 0xffffffff);
  puVar14 = (undefined8 *)0x0;
  pcStack_7e8 = (code *)0x155354;
  pcStack_620 = (code *)pcVar8;
  iVar1 = uv_fs_stat(0,auStack_7d8,puVar3,0);
  if (iVar1 == 0) {
    if (lStack_780 != 0) goto LAB_00155388;
    if ((uStack_760 & 0x1ff) == (uint)ppiVar4) {
      pcStack_7e8 = (code *)0x15537a;
      iVar1 = uv_fs_req_cleanup(auStack_7d8);
      return iVar1;
    }
  }
  else {
    pcStack_7e8 = (code *)0x155388;
    check_permission_cold_1();
LAB_00155388:
    pcStack_7e8 = (code *)0x15538d;
    check_permission_cold_2();
  }
  pcStack_7e8 = chmod_cb;
  check_permission_cold_3();
  pcStack_7e8 = (code *)puVar11;
  if (*(int *)(puVar14 + 8) == 0xd) {
    puVar11 = puVar14;
    if (puVar14[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_7f0 = (code *)0x1553b1;
      uv_fs_req_cleanup(puVar14);
      check_permission("test_file",*(uint *)*puVar14);
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_7f0 = (code *)0x1553c8;
    chmod_cb_cold_1();
  }
  pcStack_7f0 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_7f0 = (code *)puVar11;
  if (*(int *)(puVar14 + 8) == 0xe) {
    puStack_800 = puVar14;
    if (puVar14[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_7f8 = (int **)0x1553ec;
      uv_fs_req_cleanup(puVar14);
      check_permission("test_file",*(uint *)*puVar14);
      return extraout_EAX_01;
    }
  }
  else {
    ppiStack_7f8 = (int **)0x155403;
    fchmod_cb_cold_1();
    puStack_800 = puVar11;
  }
  ppiStack_7f8 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar4 = (int **)0x184385;
  ppiStack_9d0 = (int **)0x155421;
  ppiStack_7f8 = ppiVar16;
  unlink("test_file");
  ppiStack_9d0 = (int **)0x155426;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_9d0 = (int **)0x15544a;
  iVar1 = uv_fs_open(0,apiStack_9b8,"test_file",0x42,0x180,0);
  ppiVar9 = ppiStack_960;
  if (iVar1 < 0) {
    ppiStack_9d0 = (int **)0x1555e7;
    run_test_fs_unlink_readonly_cold_1();
LAB_001555e7:
    ppiStack_9d0 = (int **)0x1555ec;
    run_test_fs_unlink_readonly_cold_2();
LAB_001555ec:
    ppiStack_9d0 = (int **)0x1555f1;
    run_test_fs_unlink_readonly_cold_3();
LAB_001555f1:
    ppiStack_9d0 = (int **)0x1555f6;
    run_test_fs_unlink_readonly_cold_4();
LAB_001555f6:
    ppiStack_9d0 = (int **)0x1555fb;
    run_test_fs_unlink_readonly_cold_5();
LAB_001555fb:
    ppiStack_9d0 = (int **)0x155600;
    run_test_fs_unlink_readonly_cold_6();
LAB_00155600:
    ppiStack_9d0 = (int **)0x155605;
    run_test_fs_unlink_readonly_cold_7();
LAB_00155605:
    ppiStack_9d0 = (int **)0x15560a;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar4 = ppiStack_960;
    if ((long)ppiStack_960 < 0) goto LAB_001555e7;
    ppiVar16 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x15546d;
    uv_fs_req_cleanup(ppiVar16);
    ppiStack_9d0 = (int **)0x15547e;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_9c8 = 0;
    ppiStack_9d0 = (int **)0x1554b4;
    iov = uVar19;
    iVar1 = uv_fs_write(0,ppiVar16,(ulong)ppiVar9 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar4 = ppiVar9;
    if (iVar1 != 0xd) goto LAB_001555ec;
    if (ppiStack_960 != (int **)0xd) goto LAB_001555f1;
    ppiVar16 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x1554d6;
    uv_fs_req_cleanup(ppiVar16);
    ppiStack_9d0 = (int **)0x1554e9;
    uv_fs_close(loop,ppiVar16,(ulong)ppiVar9 & 0xffffffff,0);
    ppiStack_9d0 = (int **)0x155502;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001555f6;
    if (ppiStack_960 != (int **)0x0) goto LAB_001555fb;
    ppiVar4 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x155523;
    uv_fs_req_cleanup(ppiVar4);
    ppiVar16 = (int **)0x184385;
    ppiStack_9d0 = (int **)0x155537;
    check_permission("test_file",0x100);
    ppiStack_9d0 = (int **)0x155546;
    iVar1 = uv_fs_unlink(0,ppiVar4,"test_file",0);
    if (iVar1 != 0) goto LAB_00155600;
    if (ppiStack_960 != (int **)0x0) goto LAB_00155605;
    ppiStack_9d0 = (int **)0x155567;
    uv_fs_req_cleanup(apiStack_9b8);
    ppiStack_9d0 = (int **)0x155575;
    uv_run(loop,0);
    ppiVar16 = (int **)0x184385;
    ppiStack_9d0 = (int **)0x155591;
    uv_fs_chmod(0,apiStack_9b8,"test_file",0x180,0);
    ppiStack_9d0 = (int **)0x155599;
    uv_fs_req_cleanup(apiStack_9b8);
    ppiStack_9d0 = (int **)0x1555a1;
    unlink("test_file");
    ppiStack_9d0 = (int **)0x1555a6;
    ppiVar4 = (int **)uv_default_loop();
    ppiStack_9d0 = (int **)0x1555ba;
    uv_walk(ppiVar4,close_walk_cb,0);
    ppiStack_9d0 = (int **)0x1555c4;
    uv_run(ppiVar4,0);
    ppiStack_9d0 = (int **)0x1555c9;
    uVar5 = uv_default_loop();
    ppiStack_9d0 = (int **)0x1555d1;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  ppiStack_9d0 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar17 = apiStack_b90;
  ppiVar18 = apiStack_b90;
  ppiVar10 = apiStack_b90;
  ppiVar9 = apiStack_b90;
  puVar12 = (uv_loop_t *)0x184385;
  pcStack_b98 = (code *)0x155628;
  ppiStack_9d8 = ppiVar4;
  ppiStack_9d0 = ppiVar16;
  unlink("test_file");
  pcStack_b98 = (code *)0x155634;
  unlink("test_file_link");
  pcStack_b98 = (code *)0x155639;
  loop = (uv_loop_t *)uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  pcStack_b98 = (code *)0x15565b;
  iVar1 = uv_fs_open(0,apiStack_b90,"test_file",0x42,0x180,0);
  puVar3 = puStack_b38;
  if (iVar1 < 0) {
    pcStack_b98 = (code *)0x15592c;
    run_test_fs_chown_cold_1();
LAB_0015592c:
    pcStack_b98 = (code *)0x155931;
    run_test_fs_chown_cold_2();
LAB_00155931:
    pcStack_b98 = (code *)0x155936;
    run_test_fs_chown_cold_3();
LAB_00155936:
    ppiVar17 = ppiVar16;
    pcStack_b98 = (code *)0x15593b;
    run_test_fs_chown_cold_4();
LAB_0015593b:
    pcStack_b98 = (code *)0x155940;
    run_test_fs_chown_cold_5();
LAB_00155940:
    ppiVar18 = ppiVar17;
    pcStack_b98 = (code *)0x155945;
    run_test_fs_chown_cold_6();
LAB_00155945:
    pcStack_b98 = (code *)0x15594a;
    run_test_fs_chown_cold_7();
LAB_0015594a:
    pcStack_b98 = (code *)0x15594f;
    run_test_fs_chown_cold_8();
LAB_0015594f:
    pcStack_b98 = (code *)0x155954;
    run_test_fs_chown_cold_9();
LAB_00155954:
    pcStack_b98 = (code *)0x155959;
    run_test_fs_chown_cold_10();
LAB_00155959:
    pcStack_b98 = (code *)0x15595e;
    run_test_fs_chown_cold_11();
LAB_0015595e:
    pcStack_b98 = (code *)0x155963;
    run_test_fs_chown_cold_12();
LAB_00155963:
    pcStack_b98 = (code *)0x155968;
    run_test_fs_chown_cold_13();
LAB_00155968:
    ppiVar10 = ppiVar18;
    pcStack_b98 = (code *)0x15596d;
    run_test_fs_chown_cold_14();
LAB_0015596d:
    pcStack_b98 = (code *)0x155972;
    run_test_fs_chown_cold_15();
LAB_00155972:
    ppiVar9 = ppiVar10;
    pcStack_b98 = (code *)0x155977;
    run_test_fs_chown_cold_16();
LAB_00155977:
    pcStack_b98 = (code *)0x15597c;
    run_test_fs_chown_cold_17();
LAB_0015597c:
    pcStack_b98 = (code *)0x155981;
    run_test_fs_chown_cold_18();
LAB_00155981:
    pcStack_b98 = (code *)0x155986;
    run_test_fs_chown_cold_19();
LAB_00155986:
    pcStack_b98 = (code *)0x15598b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar12 = puStack_b38;
    if ((long)puStack_b38 < 0) goto LAB_0015592c;
    pcStack_b98 = (code *)0x15567c;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x15569b;
    iVar1 = uv_fs_chown(0,apiStack_b90,"test_file",0xffffffff,0xffffffff,0);
    puVar12 = puVar3;
    ppiVar16 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155931;
    ppiVar16 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155936;
    pcStack_b98 = (code *)0x1556ba;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x1556d4;
    iVar1 = uv_fs_fchown(0,apiStack_b90,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015593b;
    ppiVar17 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155940;
    pcStack_b98 = (code *)0x1556f3;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x15571b;
    puVar6 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_b90,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155945;
    pcStack_b98 = (code *)0x155731;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (chown_cb_count != 1) goto LAB_0015594a;
    chown_cb_count = 0;
    pcStack_b98 = (code *)0x15576a;
    puVar6 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_b90,"test_file",0,0,chown_root_cb);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_0015594f;
    pcStack_b98 = (code *)0x155780;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (chown_cb_count != 1) goto LAB_00155954;
    pcStack_b98 = (code *)0x1557b0;
    puVar6 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_b90,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155959;
    pcStack_b98 = (code *)0x1557c6;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (fchown_cb_count != 1) goto LAB_0015595e;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x1557ee;
    iVar1 = uv_fs_link(0,apiStack_b90,"test_file","test_file_link",0);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155963;
    ppiVar18 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155968;
    pcStack_b98 = (code *)0x15580d;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x15582c;
    iVar1 = uv_fs_lchown(0,apiStack_b90,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015596d;
    ppiVar10 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155972;
    pcStack_b98 = (code *)0x15584b;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x155873;
    puVar6 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_b90,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_00155977;
    pcStack_b98 = (code *)0x155889;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar9 = apiStack_b90;
    if (lchown_cb_count != 1) goto LAB_0015597c;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x1558a4;
    iVar1 = uv_fs_close(0,apiStack_b90,(ulong)puVar3 & 0xffffffff,0);
    ppiVar9 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155981;
    ppiVar9 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155986;
    pcStack_b98 = (code *)0x1558c0;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x1558ce;
    uv_run(loop,0);
    pcStack_b98 = (code *)0x1558da;
    unlink("test_file");
    pcStack_b98 = (code *)0x1558e6;
    unlink("test_file_link");
    pcStack_b98 = (code *)0x1558eb;
    puVar12 = (uv_loop_t *)uv_default_loop();
    pcStack_b98 = (code *)0x1558ff;
    uv_walk(puVar12,close_walk_cb,0);
    pcStack_b98 = (code *)0x155909;
    uv_run(puVar12,0);
    pcStack_b98 = (code *)0x15590e;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_b98 = (code *)0x155916;
    iVar1 = uv_loop_close();
    ppiVar9 = apiStack_b90;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_b98 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar6->backend_fd == 0x1a) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_ba0 = (uv_loop_t *)0x1559af;
    chown_cb_cold_1();
  }
  puStack_ba0 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_ba0 = puVar12;
  if (puVar6->backend_fd == 0x1a) {
    pcStack_ba8 = (code *)0x1559c3;
    puVar3 = puVar6;
    _Var2 = geteuid();
    pvVar7 = puVar6->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_001559db;
      pcStack_ba8 = (code *)0x1559d6;
      chown_root_cb_cold_2();
    }
    puVar12 = puVar6;
    if (pvVar7 == (void *)0x0) {
LAB_001559db:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar6);
      return iVar1;
    }
  }
  else {
    pcStack_ba8 = (code *)0x1559ef;
    chown_root_cb_cold_1();
    puVar3 = puVar6;
  }
  pcStack_ba8 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar3->backend_fd == 0x1b) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_bb0 = (code *)0x155a13;
    fchown_cb_cold_1();
  }
  pcStack_bb0 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar3->backend_fd == 0x1e) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    ppiStack_bb8 = (int **)0x155a37;
    lchown_cb_cold_1();
  }
  ppiStack_bb8 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar8 = "test_file";
  pcStack_d90 = (code *)0x155a55;
  puStack_bc0 = puVar12;
  ppiStack_bb8 = ppiVar9;
  unlink("test_file");
  pcStack_d90 = (code *)0x155a61;
  unlink("test_file_link");
  pcStack_d90 = (code *)0x155a6d;
  unlink("test_file_link2");
  pcStack_d90 = (code *)0x155a72;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar15 = (char *)0x0;
  pcStack_d90 = (code *)0x155a96;
  iVar1 = uv_fs_open(0,acStack_d78,"test_file",0x42,0x180,0);
  pcVar13 = pcStack_d20;
  if (iVar1 < 0) {
    pcStack_d90 = (code *)0x155dd4;
    run_test_fs_link_cold_1();
LAB_00155dd4:
    pcStack_d90 = (code *)0x155dd9;
    run_test_fs_link_cold_2();
LAB_00155dd9:
    pcStack_d90 = (code *)0x155dde;
    run_test_fs_link_cold_3();
LAB_00155dde:
    pcStack_d90 = (code *)0x155de3;
    run_test_fs_link_cold_4();
LAB_00155de3:
    pcStack_d90 = (code *)0x155de8;
    run_test_fs_link_cold_5();
LAB_00155de8:
    pcStack_d90 = (code *)0x155ded;
    run_test_fs_link_cold_6();
LAB_00155ded:
    pcVar13 = pcVar8;
    pcStack_d90 = (code *)0x155df2;
    run_test_fs_link_cold_7();
LAB_00155df2:
    pcStack_d90 = (code *)0x155df7;
    run_test_fs_link_cold_8();
LAB_00155df7:
    pcStack_d90 = (code *)0x155dfc;
    run_test_fs_link_cold_9();
LAB_00155dfc:
    pcStack_d90 = (code *)0x155e01;
    run_test_fs_link_cold_10();
LAB_00155e01:
    pcStack_d90 = (code *)0x155e06;
    run_test_fs_link_cold_11();
LAB_00155e06:
    pcStack_d90 = (code *)0x155e0b;
    run_test_fs_link_cold_12();
LAB_00155e0b:
    pcStack_d90 = (code *)0x155e10;
    run_test_fs_link_cold_13();
LAB_00155e10:
    pcVar8 = pcVar13;
    pcStack_d90 = (code *)0x155e15;
    run_test_fs_link_cold_14();
LAB_00155e15:
    pcStack_d90 = (code *)0x155e1a;
    run_test_fs_link_cold_15();
LAB_00155e1a:
    pcStack_d90 = (code *)0x155e1f;
    run_test_fs_link_cold_16();
LAB_00155e1f:
    pcStack_d90 = (code *)0x155e24;
    run_test_fs_link_cold_17();
LAB_00155e24:
    pcStack_d90 = (code *)0x155e29;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar8 = pcStack_d20;
    if ((long)pcStack_d20 < 0) goto LAB_00155dd4;
    pcStack_d90 = (code *)0x155ab9;
    uv_fs_req_cleanup(acStack_d78);
    pcStack_d90 = (code *)0x155aca;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155b00;
    iov = uVar19;
    iVar1 = uv_fs_write(0,acStack_d78,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = pcVar13;
    if (iVar1 != 0xd) goto LAB_00155dd9;
    if (pcStack_d20 != (char *)0xd) goto LAB_00155dde;
    pcStack_d90 = (code *)0x155b22;
    uv_fs_req_cleanup(acStack_d78);
    pcStack_d90 = (code *)0x155b35;
    uv_fs_close(loop,acStack_d78,(ulong)pcVar13 & 0xffffffff,0);
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155b50;
    iVar1 = uv_fs_link(0,acStack_d78,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155de3;
    if (pcStack_d20 != (char *)0x0) goto LAB_00155de8;
    pcStack_d90 = (code *)0x155b71;
    uv_fs_req_cleanup();
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155b8d;
    iVar1 = uv_fs_open(0,acStack_d78,"test_file_link",2,0,0);
    pcVar13 = pcStack_d20;
    pcVar8 = acStack_d78;
    if (iVar1 < 0) goto LAB_00155ded;
    if ((long)pcStack_d20 < 0) goto LAB_00155df2;
    pcStack_d90 = (code *)0x155bb0;
    uv_fs_req_cleanup(acStack_d78);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_d90 = (code *)0x155bd2;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155c04;
    iov = uVar19;
    iVar1 = uv_fs_read(0,acStack_d78,(ulong)pcVar13 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155df7;
    if ((long)pcStack_d20 < 0) goto LAB_00155dfc;
    pcVar15 = buf;
    pcStack_d90 = (code *)0x155c2b;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e01;
    pcStack_d90 = (code *)0x155c3a;
    close((int)pcVar13);
    pcStack_d90 = (code *)0x155c60;
    pcVar15 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_d78,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155e06;
    pcStack_d90 = (code *)0x155c76;
    pcVar15 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155e0b;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155ca1;
    iVar1 = uv_fs_open(0,acStack_d78,"test_file_link2",2,0,0);
    pcVar8 = pcStack_d20;
    if (iVar1 < 0) goto LAB_00155e10;
    if ((long)pcStack_d20 < 0) goto LAB_00155e15;
    pcStack_d90 = (code *)0x155cc4;
    uv_fs_req_cleanup(acStack_d78);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_d90 = (code *)0x155ce6;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155d18;
    iov = uVar19;
    iVar1 = uv_fs_read(0,acStack_d78,(ulong)pcVar8 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155e1a;
    if ((long)pcStack_d20 < 0) goto LAB_00155e1f;
    pcVar15 = buf;
    pcStack_d90 = (code *)0x155d3f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e24;
    pcStack_d90 = (code *)0x155d5c;
    uv_fs_close(loop,acStack_d78,(ulong)pcVar8 & 0xffffffff,0);
    pcStack_d90 = (code *)0x155d6a;
    uv_run(loop,0);
    pcStack_d90 = (code *)0x155d76;
    unlink("test_file");
    pcStack_d90 = (code *)0x155d82;
    unlink("test_file_link");
    pcStack_d90 = (code *)0x155d8e;
    unlink("test_file_link2");
    pcStack_d90 = (code *)0x155d93;
    pcVar8 = (char *)uv_default_loop();
    pcStack_d90 = (code *)0x155da7;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_d90 = (code *)0x155db1;
    uv_run(pcVar8,0);
    pcStack_d90 = (code *)0x155db6;
    pcVar15 = (char *)uv_default_loop();
    pcStack_d90 = (code *)0x155dbe;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_d90 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar15)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar15)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_d98 = (code *)0x155e4d;
    link_cb_cold_1();
  }
  pcStack_d98 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_d98 = (code *)pcVar8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_f50,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155f47;
    if (dummy_cb_count != 1) goto LAB_00155f4c;
    if (lStack_ef0 != 0) goto LAB_00155f51;
    if (lStack_ef8 != -2) goto LAB_00155f56;
    uv_fs_req_cleanup(auStack_f50);
    iVar1 = uv_fs_readlink(0,auStack_f50,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155f5b;
    if (lStack_ef0 != 0) goto LAB_00155f60;
    if (lStack_ef8 == -2) {
      uv_fs_req_cleanup(auStack_f50);
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar1 = uv_loop_close(uVar5);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155f6a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155f47:
    run_test_fs_readlink_cold_2();
LAB_00155f4c:
    run_test_fs_readlink_cold_3();
LAB_00155f51:
    run_test_fs_readlink_cold_4();
LAB_00155f56:
    run_test_fs_readlink_cold_5();
LAB_00155f5b:
    run_test_fs_readlink_cold_6();
LAB_00155f60:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155f6a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fs_fstat) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_stat_t* s;
#ifndef _WIN32
  struct stat t;
#endif

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  ASSERT(0 == fstat(file, &t));
  ASSERT(0 == uv_fs_fstat(NULL, &req, file, NULL));
  ASSERT(req.result == 0);
  s = req.ptr;
# if defined(__APPLE__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtimespec.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtimespec.tv_nsec);
# elif defined(__linux__)
  /* If statx() is supported, the birth time should be equal to the change time
   * because we just created the file. On older kernels, it's set to zero.
   */
  ASSERT(s->st_birthtim.tv_sec == 0 ||
         s->st_birthtim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == 0 ||
         s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec);
# endif
#endif

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  memset(&req.statbuf, 0xaa, sizeof(req.statbuf));
  r = uv_fs_fstat(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  s = req.ptr;
  ASSERT(s->st_size == sizeof(test_buf));

#ifndef _WIN32
  r = fstat(file, &t);
  ASSERT(r == 0);

  ASSERT(s->st_dev == (uint64_t) t.st_dev);
  ASSERT(s->st_mode == (uint64_t) t.st_mode);
  ASSERT(s->st_nlink == (uint64_t) t.st_nlink);
  ASSERT(s->st_uid == (uint64_t) t.st_uid);
  ASSERT(s->st_gid == (uint64_t) t.st_gid);
  ASSERT(s->st_rdev == (uint64_t) t.st_rdev);
  ASSERT(s->st_ino == (uint64_t) t.st_ino);
  ASSERT(s->st_size == (uint64_t) t.st_size);
  ASSERT(s->st_blksize == (uint64_t) t.st_blksize);
  ASSERT(s->st_blocks == (uint64_t) t.st_blocks);
#if defined(__APPLE__)
  ASSERT(s->st_atim.tv_sec == t.st_atimespec.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atimespec.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtimespec.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimespec.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctimespec.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimespec.tv_nsec);
#elif defined(_AIX)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#elif defined(__ANDROID__)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == t.st_atimensec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimensec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimensec);
#elif defined(__sun)           || \
      defined(__DragonFly__)   || \
      defined(__FreeBSD__)     || \
      defined(__OpenBSD__)     || \
      defined(__NetBSD__)      || \
      defined(_GNU_SOURCE)     || \
      defined(_BSD_SOURCE)     || \
      defined(_SVID_SOURCE)    || \
      defined(_XOPEN_SOURCE)   || \
      defined(_DEFAULT_SOURCE)
  ASSERT(s->st_atim.tv_sec == t.st_atim.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atim.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtim.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtim.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctim.tv_nsec);
# if defined(__FreeBSD__)    || \
     defined(__NetBSD__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtim.tv_nsec);
# endif
#else
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#endif
#endif

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__NetBSD__)
  ASSERT(s->st_flags == t.st_flags);
  ASSERT(s->st_gen == t.st_gen);
#else
  ASSERT(s->st_flags == 0);
  ASSERT(s->st_gen == 0);
#endif

  uv_fs_req_cleanup(&req);

  /* Now do the uv_fs_fstat call asynchronously */
  r = uv_fs_fstat(loop, &req, file, fstat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fstat_cb_count == 1);


  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}